

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::MessageFieldGenerator::GenerateCodecCode
          (MessageFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  char *text;
  FieldDescriptor *local_28;
  _func_void_FieldDescriptor_ptr *local_20;
  
  pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
  if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
    local_20 = FieldDescriptor::TypeOnceInit;
    local_28 = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x18),&local_20,&local_28);
  }
  text = "pb::FieldCodec.ForGroup($tag$, $end_tag$, $type_name$.Parser)";
  if (pFVar1[2] == (FieldDescriptor)0xb) {
    text = "pb::FieldCodec.ForMessage($tag$, $type_name$.Parser)";
  }
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateCodecCode(io::Printer* printer) {
  if (descriptor_->type() == FieldDescriptor::Type::TYPE_MESSAGE) {
    printer->Print(
      variables_,
      "pb::FieldCodec.ForMessage($tag$, $type_name$.Parser)");
  } else {
    printer->Print(
      variables_,
      "pb::FieldCodec.ForGroup($tag$, $end_tag$, $type_name$.Parser)");
  }
}